

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseProperties
          (AsciiParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          *props,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX_01;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX_02;
  string tok;
  ostringstream ss_e;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  bVar2 = SkipWhitespace(this);
  if (!bVar2) {
    return false;
  }
  uVar1 = this->_sr->idx_;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  bVar2 = ReadIdentifier(this,&local_1e0);
  propNames_00 = extraout_RDX;
  if (bVar2) {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_1e0);
    if (iVar3 != 0) {
      bVar2 = true;
      propNames_00 = extraout_RDX_00;
      if (uVar1 <= this->_sr->length_) {
        this->_sr->idx_ = uVar1;
      }
      goto LAB_0038d141;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"ParseProperties",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<(local_1a0,0x11d9);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"TODO: Parse rel",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    ::std::ios_base::~ios_base(local_130);
    propNames_00 = extraout_RDX_01;
  }
  bVar2 = false;
LAB_0038d141:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
    propNames_00 = extraout_RDX_02;
  }
  if (!bVar2) {
    return false;
  }
  bVar2 = ParsePrimProps(this,props,propNames_00);
  return bVar2;
}

Assistant:

bool AsciiParser::ParseProperties(std::map<std::string, Property> *props,
                                  std::vector<value::token> *propNames) {
  // property : primm_attr
  //          | 'rel' name '=' path
  //          ;

  if (!SkipWhitespace()) {
    return false;
  }

  // rel?
  {
    uint64_t loc = CurrLoc();
    std::string tok;

    if (!ReadIdentifier(&tok)) {
      return false;
    }

    if (tok == "rel") {
      PUSH_ERROR_AND_RETURN("TODO: Parse rel");
    } else {
      SeekTo(loc);
    }
  }

  // attribute
  return ParsePrimProps(props, propNames);
}